

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O3

void writeReads(BamReader *br,RefVector *ref,int refID,string *refName,int st,int en,int bpRegion,
               string *folderPath)

{
  pointer pcVar1;
  bool bVar2;
  vector<int,_std::allocator<int>_> clipSizes;
  vector<int,_std::allocator<int>_> genomePositions;
  vector<int,_std::allocator<int>_> readPositions;
  vector<SoftNode,_std::allocator<SoftNode>_> insNodesDown;
  vector<SoftNode,_std::allocator<SoftNode>_> insNodesUp;
  vector<SoftCluster,_std::allocator<SoftCluster>_> insClustersDown;
  vector<SoftCluster,_std::allocator<SoftCluster>_> insClustersUp;
  BamAlignment aln;
  ofstream ofs;
  int local_48c;
  undefined1 *local_488 [2];
  undefined1 local_478 [16];
  vector<int,_std::allocator<int>_> local_468;
  RefVector *local_450;
  vector<int,_std::allocator<int>_> local_448;
  vector<int,_std::allocator<int>_> local_428;
  vector<SoftNode,_std::allocator<SoftNode>_> local_408;
  vector<SoftNode,_std::allocator<SoftNode>_> local_3e8;
  vector<SoftCluster,_std::allocator<SoftCluster>_> local_3c8;
  vector<SoftCluster,_std::allocator<SoftCluster>_> local_3a8;
  BamAlignment local_388;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_48c = refID;
  local_450 = ref;
  std::ofstream::ofstream(&local_230);
  local_488[0] = local_478;
  pcVar1 = (folderPath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_488,pcVar1,pcVar1 + folderPath->_M_string_length);
  std::__cxx11::string::append((char *)local_488);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)local_488);
  local_3e8.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3e8.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3e8.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_408.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_408.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_408.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3a8.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a8.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388.Name._M_dataplus._M_p._0_4_ = st - bpRegion;
  local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,en + bpRegion);
  BamTools::BamReader::SetRegion(br,&local_48c,(int *)&local_388,&local_48c,(int *)&local_468);
  BamTools::BamAlignment::BamAlignment(&local_388);
  while( true ) {
    bVar2 = BamTools::BamReader::GetNextAlignment(br,&local_388);
    if (!bVar2) break;
    bVar2 = BamTools::BamAlignment::IsMapped(&local_388);
    if (bVar2) {
      if (0x13 < local_388.MapQuality) {
        local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        bVar2 = BamTools::BamAlignment::GetSoftClips
                          (&local_388,&local_468,&local_428,&local_448,false);
        if (bVar2) {
          outputFastq(&local_388,(ofstream *)&local_230);
          addSC(&local_388,local_450,&local_3e8,&local_408);
        }
        if (local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
    }
    else {
      outputFastq(&local_388,(ofstream *)&local_230);
    }
  }
  std::ofstream::close();
  BamTools::BamAlignment::~BamAlignment(&local_388);
  std::vector<SoftCluster,_std::allocator<SoftCluster>_>::~vector(&local_3c8);
  std::vector<SoftCluster,_std::allocator<SoftCluster>_>::~vector(&local_3a8);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&local_408);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&local_3e8);
  if (local_488[0] != local_478) {
    operator_delete(local_488[0]);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _inflate;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void writeReads(BamTools::BamReader &br, const BamTools::RefVector &ref, int refID, const std::string &refName, int st, int en, int bpRegion, const std::string &folderPath)
{
	std::ofstream ofs;
	std::string outFile = folderPath + "tmp/ins/reads.fastq";
	ofs.open(outFile, std::ofstream::out | std::ofstream::app);

	std::vector<SoftNode> insNodesUp, insNodesDown;
	std::vector<SoftCluster> insClustersUp, insClustersDown;

	br.SetRegion(refID, st - bpRegion, refID, en + bpRegion);
	BamTools::BamAlignment aln;
	while (br.GetNextAlignment(aln))
	{
		// OEA unmapped reads have mapping qual 0
		// current aln is unmapped, but it's mate lies in region, hence we can even parse cur aln
		if (!aln.IsMapped())
		{
			outputFastq(aln, ofs);
			continue;
		}

		if (aln.MapQuality < MIN_MAP_QUAL)
			continue;

		std::vector<int> clipSizes, readPositions, genomePositions;
		bool isSC = aln.GetSoftClips(clipSizes, readPositions, genomePositions);
		if (isSC)
		{
			outputFastq(aln, ofs);
			addSC(aln, ref, insNodesUp, insNodesDown);
		}
	}
	ofs.close();
}